

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-wrap.cpp
# Opt level: O3

CommandOptions * write_PCM_file(CommandOptions *Options)

{
  long *plVar1;
  undefined8 uVar2;
  FILE *pFVar3;
  int iVar4;
  Rational *this;
  long lVar5;
  char *pcVar6;
  AESEncContext *this_00;
  HMACContext *this_01;
  uint uVar7;
  long in_RSI;
  MyInfo *pMVar8;
  long *plVar9;
  byte bVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  double dVar17;
  undefined1 auVar16 [16];
  FortunaRNG RNG;
  char buf [64];
  long *local_300 [2];
  long local_2f0 [2];
  long *local_2e0 [2];
  long local_2d0 [2];
  long *local_2c0 [2];
  long local_2b0 [2];
  undefined4 local_2a0;
  MXFWriter Writer;
  AudioDescriptor ADesc;
  Result_t result;
  byte_t IV_buf [16];
  long local_198 [3];
  FrameBuffer FrameBuffer;
  PCMParserList Parser;
  Result_t local_100 [104];
  AudioDescriptor local_98 [2];
  
  bVar10 = 0;
  ASDCP::PCMParserList::PCMParserList(&Parser);
  AS_02::PCM::MXFWriter::MXFWriter(&Writer);
  ASDCP::FrameBuffer::FrameBuffer(&FrameBuffer.super_FrameBuffer);
  FrameBuffer._0_8_ = &PTR__FrameBuffer_0011ab50;
  ASDCP::PCMParserList::OpenRead((list *)&result,(Rational *)&Parser);
  if (-1 < _result) {
    ADesc.EditRate.Numerator = 0;
    ADesc.EditRate.Denominator = 0;
    ADesc.AudioSamplingRate.Numerator = 0;
    ADesc.AudioSamplingRate.Denominator = 0;
    ASDCP::PCMParserList::FillAudioDescriptor(local_98);
    Kumu::Result_t::~Result_t((Result_t *)local_98);
    ADesc.EditRate = *(Rational *)(in_RSI + 0x18);
    auVar12._0_8_ = (double)ADesc.AudioSamplingRate.Numerator;
    auVar12._8_8_ = (double)ADesc.EditRate.Numerator;
    auVar15._0_8_ = (double)ADesc.AudioSamplingRate.Denominator;
    auVar15._8_8_ = (double)ADesc.EditRate.Denominator;
    auVar12 = divpd(auVar12,auVar15);
    ceil(auVar12._0_8_ / auVar12._8_8_);
    ASDCP::FrameBuffer::Capacity((uint)local_100);
    Kumu::Result_t::~Result_t(local_100);
    pFVar3 = _stderr;
    if (*(char *)(in_RSI + 5) == '\x01') {
      dVar14 = (double)ADesc.AudioSamplingRate.Numerator;
      dVar17 = (double)ADesc.AudioSamplingRate.Denominator;
      snprintf(buf,0x40,"%d/%d",(ulong)*(uint *)(in_RSI + 0x18),(ulong)*(uint *)(in_RSI + 0x1c));
      auVar13._0_8_ = (double)ADesc.AudioSamplingRate.Numerator;
      auVar13._8_8_ = (double)ADesc.EditRate.Numerator;
      auVar16._0_8_ = (double)ADesc.AudioSamplingRate.Denominator;
      auVar16._8_8_ = (double)ADesc.EditRate.Denominator;
      auVar12 = divpd(auVar13,auVar16);
      dVar11 = ceil(auVar12._0_8_ / auVar12._8_8_);
      fprintf(pFVar3,"%.1fkHz PCM Audio, %s fps (%u spf)\n",(dVar14 / dVar17) / 1000.0,buf,
              (long)dVar11);
      fputs("AudioDescriptor:\n",_stderr);
      ASDCP::PCM::AudioDescriptorDump(&ADesc,(_IO_FILE *)0x0);
    }
    this = (Rational *)operator_new(0x1e8);
    ASDCP::MXF::WaveAudioDescriptor::WaveAudioDescriptor((WaveAudioDescriptor *)this,g_dict);
    ASDCP::PCM_ADesc_to_MD((AudioDescriptor *)buf,(WaveAudioDescriptor *)&ADesc);
    Kumu::Result_t::operator=(&result,(Result_t *)buf);
    Kumu::Result_t::~Result_t((Result_t *)buf);
    plVar1 = (long *)(in_RSI + 0x110);
    if (*(long **)(in_RSI + 0x110) == plVar1) {
      *(undefined1 *)&this[0x39].Numerator = *(undefined1 *)(in_RSI + 0x78);
      uVar2 = *(undefined8 *)(in_RSI + 0x81);
      *(undefined8 *)((long)&this[0x39].Numerator + 1) = *(undefined8 *)(in_RSI + 0x79);
      *(undefined8 *)((long)&this[0x3a].Numerator + 1) = uVar2;
      *(undefined1 *)&this[0x3c].Numerator = 1;
    }
    else {
      iVar4 = ASDCP::MXF::ASDCP_MCAConfigParser::ChannelCount();
      pFVar3 = _stderr;
      if (iVar4 != this[0x2d].Numerator) {
        uVar7 = ASDCP::MXF::ASDCP_MCAConfigParser::ChannelCount();
        fprintf(pFVar3,"MCA label count (%d) differs from essence stream channel count (%d).\n",
                (ulong)uVar7,(ulong)(uint)this[0x2d].Numerator);
        Kumu::Result_t::Result_t((Result_t *)Options,(Result_t *)&Kumu::RESULT_FAIL);
        goto LAB_0010e04e;
      }
      plVar9 = (long *)*plVar1;
      if (plVar9 != plVar1) {
        do {
          if ((plVar9[2] != 0) &&
             (lVar5 = __dynamic_cast(plVar9[2],&ASDCP::MXF::InterchangeObject::typeinfo,
                                     &ASDCP::MXF::SoundfieldGroupLabelSubDescriptor::typeinfo,0),
             lVar5 != 0)) {
            if (*(long *)(in_RSI + 0x2d0) != 0) {
              ASDCP::MXF::UTF16String::UTF16String((UTF16String *)buf,(string *)(in_RSI + 0x2c8));
              std::__cxx11::string::_M_assign((string *)(lVar5 + 0x298));
              *(undefined1 *)(lVar5 + 0x2b8) = 1;
              if ((char *)buf._8_8_ != buf + 0x18) {
                operator_delete((void *)buf._8_8_,buf._24_8_ + 1);
              }
            }
            if (*(long *)(in_RSI + 0x2b0) != 0) {
              ASDCP::MXF::UTF16String::UTF16String((UTF16String *)buf,(string *)(in_RSI + 0x2a8));
              std::__cxx11::string::_M_assign((string *)(lVar5 + 0x2c8));
              *(undefined1 *)(lVar5 + 0x2e8) = 1;
              if ((char *)buf._8_8_ != buf + 0x18) {
                operator_delete((void *)buf._8_8_,buf._24_8_ + 1);
              }
            }
          }
          plVar9 = (long *)*plVar9;
        } while (plVar9 != plVar1);
      }
      pcVar6 = (char *)ASDCP::Dictionary::Type((MDD_t)g_dict);
      buf._0_8_ = *(undefined8 *)pcVar6;
      buf._8_8_ = *(undefined8 *)(pcVar6 + 8);
      *(undefined1 *)&this[0x39].Numerator = 1;
      *(undefined8 *)((long)&this[0x39].Numerator + 1) = buf._0_8_;
      *(undefined8 *)((long)&this[0x3a].Numerator + 1) = buf._8_8_;
      *(undefined1 *)&this[0x3c].Numerator = 1;
    }
    if (-1 < _result) {
      if (*(char *)(in_RSI + 0xc) == '\0') {
        pMVar8 = &s_MyInfo;
        pcVar6 = buf;
        for (lVar5 = 8; lVar5 != 0; lVar5 = lVar5 + -1) {
          *(undefined8 *)pcVar6 = *(undefined8 *)(pMVar8->super_WriterInfo).ProductUUID;
          pMVar8 = (MyInfo *)((long)pMVar8 + ((ulong)bVar10 * -2 + 1) * 8);
          pcVar6 = pcVar6 + (ulong)bVar10 * -0x10 + 8;
        }
        local_300[0] = local_2f0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_300,s_MyInfo.super_WriterInfo.ProductVersion._M_dataplus._M_p,
                   s_MyInfo.super_WriterInfo.ProductVersion._M_dataplus._M_p +
                   s_MyInfo.super_WriterInfo.ProductVersion._M_string_length);
        local_2e0[0] = local_2d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2e0,s_MyInfo.super_WriterInfo.CompanyName._M_dataplus._M_p,
                   s_MyInfo.super_WriterInfo.CompanyName._M_dataplus._M_p +
                   s_MyInfo.super_WriterInfo.CompanyName._M_string_length);
        local_2c0[0] = local_2b0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2c0,s_MyInfo.super_WriterInfo.ProductName._M_dataplus._M_p,
                   s_MyInfo.super_WriterInfo.ProductName._M_dataplus._M_p +
                   s_MyInfo.super_WriterInfo.ProductName._M_string_length);
        local_2a0 = 2;
        if (*(char *)(in_RSI + 2) == '\x01') {
          buf._16_8_ = *(undefined8 *)(in_RSI + 0x45);
          buf._24_8_ = *(undefined8 *)(in_RSI + 0x4d);
        }
        else {
          Kumu::GenRandomUUID((uchar *)(buf + 0x10));
        }
        if (*(char *)(in_RSI + 1) == '\x01') {
          Kumu::FortunaRNG::FortunaRNG(&RNG);
          Kumu::GenRandomUUID((uchar *)(buf + 0x20));
          if (*(char *)(in_RSI + 0x34) == '\x01') {
            buf._48_8_ = *(undefined8 *)(in_RSI + 0x35);
            buf._56_8_ = *(undefined8 *)(in_RSI + 0x3d);
          }
          else {
            ADesc.AudioSamplingRate.Numerator = 0;
            ADesc.AudioSamplingRate.Denominator = 0;
            ADesc.Locked = 0;
            ADesc.ChannelCount = 0;
            ADesc.QuantizationBits = ADesc.QuantizationBits & 0xffffff00;
            ADesc.EditRate = (Rational)&PTR__IArchive_0011aaa8;
            Kumu::GenRandomValue((UUID *)&ADesc);
            buf._51_4_ = ADesc.AudioSamplingRate.Denominator;
            buf._48_3_ = ADesc.AudioSamplingRate.Numerator._1_3_;
            buf[0x37] = (char)ADesc.Locked;
            buf._59_4_ = ADesc.ChannelCount;
            buf._56_3_ = ADesc.Locked._1_3_;
            buf[0x3f] = (char)ADesc.QuantizationBits;
          }
          this_00 = (AESEncContext *)operator_new(8);
          ASDCP::AESEncContext::AESEncContext(this_00);
          ASDCP::AESEncContext::InitKey((uchar *)&ADesc);
          Kumu::Result_t::operator=(&result,(Result_t *)&ADesc);
          Kumu::Result_t::~Result_t((Result_t *)&ADesc);
          if (-1 < _result) {
            Kumu::FortunaRNG::FillRandom((uchar *)&RNG,(uint)IV_buf);
            ASDCP::AESEncContext::SetIVec((uchar *)&ADesc);
            Kumu::Result_t::operator=(&result,(Result_t *)&ADesc);
            Kumu::Result_t::~Result_t((Result_t *)&ADesc);
            if ((-1 < _result) && (*(char *)(in_RSI + 4) == '\x01')) {
              this_01 = (HMACContext *)operator_new(8);
              ASDCP::HMACContext::HMACContext(this_01);
              ASDCP::HMACContext::InitKey((uchar *)&ADesc,(LabelSet_t)this_01);
              Kumu::Result_t::operator=(&result,(Result_t *)&ADesc);
              Kumu::Result_t::~Result_t((Result_t *)&ADesc);
            }
          }
          Kumu::FortunaRNG::~FortunaRNG(&RNG);
        }
        if (-1 < _result) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)IV_buf,*(char **)(in_RSI + 0x268),(allocator<char> *)&RNG);
          AS_02::PCM::MXFWriter::OpenWrite
                    ((string *)&ADesc,(WriterInfo *)&Writer,(FileDescriptor *)IV_buf,(list *)buf,
                     this,(uint)plVar1);
          Kumu::Result_t::operator=(&result,(Result_t *)&ADesc);
          Kumu::Result_t::~Result_t((Result_t *)&ADesc);
          if ((long *)IV_buf._0_8_ != local_198) {
            operator_delete((void *)IV_buf._0_8_,local_198[0] + 1);
          }
        }
        if (local_2c0[0] != local_2b0) {
          operator_delete(local_2c0[0],local_2b0[0] + 1);
        }
        if (local_2e0[0] != local_2d0) {
          operator_delete(local_2e0[0],local_2d0[0] + 1);
        }
        if (local_300[0] != local_2f0) {
          operator_delete(local_300[0],local_2f0[0] + 1);
        }
        if (_result < 0) goto LAB_0010e039;
      }
      ASDCP::PCMParserList::Reset();
      Kumu::Result_t::operator=(&result,(Result_t *)buf);
      Kumu::Result_t::~Result_t((Result_t *)buf);
      if ((-1 < _result) && (*(int *)(in_RSI + 0x10) != 0)) {
        uVar7 = 0;
        while( true ) {
          ASDCP::PCMParserList::ReadFrame((FrameBuffer *)buf);
          Kumu::Result_t::operator=(&result,(Result_t *)buf);
          Kumu::Result_t::~Result_t((Result_t *)buf);
          if (_result < 0) break;
          if (*(char *)(in_RSI + 5) == '\x01') {
            ASDCP::PCM::FrameBuffer::Dump((_IO_FILE *)&FrameBuffer,(uint)_stderr);
          }
          if (*(char *)(in_RSI + 0xc) == '\0') {
            AS_02::PCM::MXFWriter::WriteFrame
                      ((FrameBuffer *)buf,(AESEncContext *)&Writer,(HMACContext *)&FrameBuffer);
            Kumu::Result_t::operator=(&result,(Result_t *)buf);
            Kumu::Result_t::~Result_t((Result_t *)buf);
          }
          if ((_result < 0) || (uVar7 = uVar7 + 1, *(uint *)(in_RSI + 0x10) <= uVar7)) break;
        }
      }
      if (_result == Kumu::RESULT_ENDOFFILE) {
        Kumu::Result_t::operator=(&result,(Result_t *)Kumu::RESULT_OK);
      }
      if ((-1 < _result) && (*(char *)(in_RSI + 0xc) == '\0')) {
        AS_02::PCM::MXFWriter::Finalize();
        Kumu::Result_t::operator=(&result,(Result_t *)buf);
        Kumu::Result_t::~Result_t((Result_t *)buf);
      }
    }
  }
LAB_0010e039:
  Kumu::Result_t::Result_t((Result_t *)Options,&result);
LAB_0010e04e:
  Kumu::Result_t::~Result_t(&result);
  ASDCP::FrameBuffer::~FrameBuffer(&FrameBuffer.super_FrameBuffer);
  AS_02::PCM::MXFWriter::~MXFWriter(&Writer);
  ASDCP::PCMParserList::~PCMParserList(&Parser);
  return Options;
}

Assistant:

Result_t
write_PCM_file(CommandOptions& Options)
{
  AESEncContext*    Context = 0;
  HMACContext*      HMAC = 0;
  PCMParserList     Parser;
  AS_02::PCM::MXFWriter    Writer;
  PCM::FrameBuffer  FrameBuffer;
  ASDCP::MXF::WaveAudioDescriptor *essence_descriptor = 0;

  // set up essence parser
  Result_t result = Parser.OpenRead(Options.filenames, Options.edit_rate);

  // set up MXF writer
  if ( ASDCP_SUCCESS(result) )
    {
      ASDCP::PCM::AudioDescriptor ADesc;
      Parser.FillAudioDescriptor(ADesc);

      ADesc.EditRate = Options.edit_rate;
      FrameBuffer.Capacity(PCM::CalcFrameBufferSize(ADesc));

      if ( Options.verbose_flag )
	{
	  char buf[64];
	  fprintf(stderr, "%.1fkHz PCM Audio, %s fps (%u spf)\n",
		  ADesc.AudioSamplingRate.Quotient() / 1000.0,
		  RationalToString(Options.edit_rate, buf, 64),
		  PCM::CalcSamplesPerFrame(ADesc));
	  fputs("AudioDescriptor:\n", stderr);
	  PCM::AudioDescriptorDump(ADesc);
	}

      essence_descriptor = new ASDCP::MXF::WaveAudioDescriptor(g_dict);

      result = ASDCP::PCM_ADesc_to_MD(ADesc, essence_descriptor);

      if ( Options.mca_config.empty() )
	{
	  essence_descriptor->ChannelAssignment = Options.channel_assignment;
	}
      else
	{
	  if ( Options.mca_config.ChannelCount() != essence_descriptor->ChannelCount )
	    {
	      fprintf(stderr, "MCA label count (%d) differs from essence stream channel count (%d).\n",
		      Options.mca_config.ChannelCount(), essence_descriptor->ChannelCount);
	      return RESULT_FAIL;
	    }

	  // This marks all soundfield groups using the same MCA property values
	  MXF::InterchangeObject_list_t::iterator i;
	  for ( i = Options.mca_config.begin(); i != Options.mca_config.end(); ++i )
	    {
	      MXF::SoundfieldGroupLabelSubDescriptor * desc = dynamic_cast<MXF::SoundfieldGroupLabelSubDescriptor*>(*i);
	      if ( desc != 0 )
		{
		  if ( ! Options.mca_audio_content_kind.empty() )
		    {
		      desc->MCAAudioContentKind = Options.mca_audio_content_kind;
		    }
		  if ( ! Options.mca_audio_element_kind.empty() )
		    {
		      desc->MCAAudioElementKind = Options.mca_audio_element_kind;
		    }
		}
	    }

	  essence_descriptor->ChannelAssignment = g_dict->ul(MDD_IMFAudioChannelCfg_MCA);
	}
    }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
    {
      WriterInfo Info = s_MyInfo;  // fill in your favorite identifiers here
      Info.LabelSetType = LS_MXF_SMPTE;

      if ( Options.asset_id_flag )
	memcpy(Info.AssetUUID, Options.asset_id_value, UUIDlen);
      else
	Kumu::GenRandomUUID(Info.AssetUUID);

#ifdef HAVE_OPENSSL
      // configure encryption
      if( Options.key_flag )
	{
      byte_t            IV_buf[CBC_BLOCK_SIZE];
      Kumu::FortunaRNG  RNG;
	  Kumu::GenRandomUUID(Info.ContextID);
	  Info.EncryptedEssence = true;

	  if ( Options.key_id_flag )
	    {
	      memcpy(Info.CryptographicKeyID, Options.key_id_value, UUIDlen);
	    }
	  else
	    {
	      create_random_uuid(Info.CryptographicKeyID);
	    }

	  Context = new AESEncContext;
	  result = Context->InitKey(Options.key_value);

	  if ( ASDCP_SUCCESS(result) )
	    result = Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));

	  if ( ASDCP_SUCCESS(result) && Options.write_hmac )
	    {
	      Info.UsesHMAC = true;
	      HMAC = new HMACContext;
	      result = HMAC->InitKey(Options.key_value, Info.LabelSetType);
	    }
	}
#endif // HAVE_OPENSSL

      if ( ASDCP_SUCCESS(result) )
	{
	  result = Writer.OpenWrite(Options.out_file.c_str(), Info, essence_descriptor,
				    Options.mca_config, Options.edit_rate);
	}
    }

  if ( ASDCP_SUCCESS(result) )
    {
      result = Parser.Reset();
      ui32_t duration = 0;

      while ( ASDCP_SUCCESS(result) && duration++ < Options.duration )
	{
	  result = Parser.ReadFrame(FrameBuffer);

	  if ( ASDCP_SUCCESS(result) )
	    {
	      if ( Options.verbose_flag )
		FrameBuffer.Dump(stderr, Options.fb_dump_size);

	      if ( ! Options.no_write_flag )
		{
		  result = Writer.WriteFrame(FrameBuffer, Context, HMAC);

		  // The Writer class will forward the last block of ciphertext
		  // to the encryption context for use as the IV for the next
		  // frame. If you want to use non-sequitur IV values, un-comment
		  // the following  line of code.
		  // if ( ASDCP_SUCCESS(result) && Options.key_flag )
		  //   Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));
		}
	    }
	}

      if ( result == RESULT_ENDOFFILE )
	result = RESULT_OK;
    }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
    result = Writer.Finalize();

  return result;
}